

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-strutil.cc
# Opt level: O0

void strutil_test(void)

{
  bool bVar1;
  int iVar2;
  allocator local_81;
  undefined1 local_80 [8];
  string s_1;
  string ls;
  allocator local_29;
  undefined1 local_28 [8];
  string s;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_28,"HelloA WorlZ",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  tinyusdz::to_lower((string *)((long)&s_1.field_2 + 8),(string *)local_28);
  iVar2 = std::__cxx11::string::compare(s_1.field_2._M_local_buf + 8);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-strutil.cc"
                 ,0x11,"%s","ls.compare(\"helloa worlz\") == 0");
  std::__cxx11::string::~string((string *)(s_1.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_80,"_aaa",&local_81);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  bVar1 = tinyusdz::is_valid_utf8_identifier((string *)local_80);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-strutil.cc"
                 ,0x16,"%s","is_valid_utf8_identifier(s)");
  std::__cxx11::string::operator=((string *)local_80,"___");
  bVar1 = tinyusdz::is_valid_utf8_identifier((string *)local_80);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-strutil.cc"
                 ,0x1a,"%s","is_valid_utf8_identifier(s)");
  std::__cxx11::string::operator=((string *)local_80,"customLayerData");
  bVar1 = tinyusdz::isValidIdentifier((string *)local_80,true);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-strutil.cc"
                 ,0x1d,"%s","isValidIdentifier(s)");
  std::__cxx11::string::operator=((string *)local_80,anon_var_dwarf_7fd66);
  bVar1 = tinyusdz::isValidIdentifier((string *)local_80,true);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-strutil.cc"
                 ,0x21,"%s","isValidIdentifier(s)");
  std::__cxx11::string::operator=((string *)local_80,anon_var_dwarf_7fd70);
  bVar1 = tinyusdz::isValidIdentifier((string *)local_80,true);
  acutest_check_((byte)~bVar1 & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-strutil.cc"
                 ,0x25,"%s","!isValidIdentifier(s)");
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

void strutil_test(void) {
  {
    std::string s = "HelloA WorlZ";
    std::string ls = tinyusdz::to_lower(s);
    TEST_CHECK(ls.compare("helloa worlz") == 0);
  }

  {
    std::string s = "_aaa";
    TEST_CHECK(is_valid_utf8_identifier(s));

    // TODO: Do not allow underscore-only identifier?
    s = "___";
    TEST_CHECK(is_valid_utf8_identifier(s));

    s = "customLayerData";
    TEST_CHECK(isValidIdentifier(s));

    // Now TinyUSDZ allow UTF-8 string as identifier by default.
    s = u8"響";
    TEST_CHECK(isValidIdentifier(s));

    // Emoji in identifier is not allowed.
    s = u8"_hello😩";
    TEST_CHECK(!isValidIdentifier(s));

  }
}